

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MauProxy.h
# Opt level: O0

void __thiscall mau::PacketQueue::Pop(PacketQueue *this)

{
  PacketQueue *this_local;
  
  if (this->Head != (QueueNode *)0x0) {
    this->Head = this->Head->Next;
    if (this->Head == (QueueNode *)0x0) {
      this->Tail = (QueueNode *)0x0;
    }
    else {
      this->Head->Prev = (QueueNode *)0x0;
    }
  }
  return;
}

Assistant:

void Pop()
    {
        if (!Head) {
            return;
        }

        Head = Head->Next;
        if (!Head) {
            Tail = nullptr;
        }
        else {
            Head->Prev = nullptr;
        }
    }